

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::iterate(CopyImageTest *this)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Iteration iterations [6];
  IterationFunc iteration2 [1];
  IterationFunc iteration6 [2];
  IterationFunc iteration4 [2];
  IterationFunc iteration3 [2];
  IterationFunc iteration5 [3];
  IterationFunc iteration1 [3];
  int local_148 [2];
  code **local_140;
  undefined4 local_138;
  code **local_130;
  undefined4 local_128;
  code **local_120;
  undefined4 local_118;
  code **local_110;
  undefined4 local_108;
  code **local_100;
  undefined4 local_f8;
  code **local_f0;
  code *local_e8;
  undefined8 uStack_e0;
  code *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 uStack_80;
  code *local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 uStack_60;
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  
  uStack_40 = 0;
  uStack_30 = 0;
  uStack_20 = 0;
  local_48 = logTestInfoIter;
  local_38 = createImagesIter;
  local_28 = renderSourceIter;
  local_e8 = renderDestinationIter;
  uStack_e0 = 0;
  local_88 = verifySourceIter;
  uStack_80 = 0;
  local_98 = copyImageIter;
  uStack_90 = 0;
  local_a8 = destroyImagesIter;
  uStack_a0 = 0;
  local_b8 = verifyDestinationIter;
  uStack_b0 = 0;
  uStack_70 = 0;
  uStack_60 = 0;
  uStack_50 = 0;
  local_78 = createImagesIter;
  local_68 = copyImageIter;
  local_58 = verifySourceIter;
  local_c8 = destroyImagesIter;
  uStack_c0 = 0;
  local_d8 = verifyDestinationIter;
  uStack_d0 = 0;
  local_148[0] = 3;
  local_140 = &local_48;
  local_138 = 1;
  local_130 = &local_e8;
  local_128 = 2;
  local_120 = &local_98;
  local_118 = 2;
  local_110 = &local_b8;
  local_108 = 3;
  local_100 = &local_78;
  local_f8 = 2;
  local_f0 = &local_d8;
  iVar3 = this->m_iteration;
  lVar1 = (long)iVar3;
  if (0 < local_148[lVar1 * 4]) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pcVar2 = *(code **)((long)(&local_140)[lVar1 * 2] + lVar4 + -8);
      if (((ulong)pcVar2 & 1) != 0) {
        pcVar2 = *(code **)(pcVar2 + *(long *)((long)&((CopyImageTest *)
                                                      (&((CopyImageTest *)
                                                        (&((CopyImageTest *)
                                                          (&this->m_srcImageInfo + -6))->
                                                          m_srcImageInfo + -6))->m_srcImageInfo + -6
                                                      ))->m_srcImageInfo +
                                              *(long *)((long)(&local_140)[lVar1 * 2] + lVar4) +
                                              0xffffffffffffff88U) + -1);
      }
      (*pcVar2)();
      lVar5 = lVar5 + 1;
      iVar3 = this->m_iteration;
      lVar1 = (long)iVar3;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < local_148[lVar1 * 4]);
  }
  iVar3 = iVar3 + 1;
  this->m_iteration = iVar3;
  if (iVar3 >= 6) {
    tcu::ResultCollector::setTestContextResult
              (&this->m_state->results,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  return (uint)(iVar3 < 6);
}

Assistant:

TestCase::IterateResult CopyImageTest::iterate (void)
{
	// Note: Returning from iterate() has two side-effects: it touches
	// watchdog and calls eglSwapBuffers. For the first it's important
	// to keep work per iteration reasonable to avoid
	// timeouts. Because of the latter, it's prudent to do more than
	// trivial amount of work. Otherwise we'll end up waiting for a
	// new buffer in swap, it seems.

	// The split below tries to combine trivial work with actually
	// expensive rendering iterations without having too much
	// rendering in one iteration to avoid timeouts.
	const IterationFunc iteration1[] =
	{
		&CopyImageTest::logTestInfoIter,
		&CopyImageTest::createImagesIter,
		&CopyImageTest::renderSourceIter
	};
	const IterationFunc iteration2[] =
	{
		&CopyImageTest::renderDestinationIter
	};
	const IterationFunc iteration3[] =
	{
		&CopyImageTest::copyImageIter,
		&CopyImageTest::verifySourceIter
	};
	const IterationFunc iteration4[] =
	{
		&CopyImageTest::verifyDestinationIter,
		&CopyImageTest::destroyImagesIter
	};
	const IterationFunc iteration5[] =
	{
		&CopyImageTest::createImagesIter,
		&CopyImageTest::copyImageIter,
		&CopyImageTest::verifySourceIter
	};
	const IterationFunc iteration6[] =
	{
		&CopyImageTest::verifyDestinationIter,
		&CopyImageTest::destroyImagesIter
	};
	const Iteration iterations[] =
	{
		Iteration(DE_LENGTH_OF_ARRAY(iteration1), iteration1),
		Iteration(DE_LENGTH_OF_ARRAY(iteration2), iteration2),
		Iteration(DE_LENGTH_OF_ARRAY(iteration3), iteration3),
		Iteration(DE_LENGTH_OF_ARRAY(iteration4), iteration4),
		Iteration(DE_LENGTH_OF_ARRAY(iteration5), iteration5),
		Iteration(DE_LENGTH_OF_ARRAY(iteration6), iteration6)
	};

	DE_ASSERT(m_iteration < DE_LENGTH_OF_ARRAY(iterations));
	for (int method = 0; method < iterations[m_iteration].methodCount; method++)
		(this->*iterations[m_iteration].methods[method])();

	m_iteration++;

	if (m_iteration < DE_LENGTH_OF_ARRAY(iterations))
	{
		return CONTINUE;
	}
	else
	{
		m_state->results.setTestContextResult(m_testCtx);
		return STOP;
	}
}